

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O1

lightlist_t * P_GetPlaneLight(sector_t *sector,secplane_t *plane,bool underside)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  extsector_t *peVar4;
  lightlist_t *plVar5;
  undefined7 in_register_00000011;
  long lVar6;
  double dVar7;
  
  peVar4 = sector->e;
  dVar1 = (sector->centerspot).X;
  dVar2 = (sector->centerspot).Y;
  dVar7 = ((plane->normal).Y * dVar2 + (plane->normal).X * dVar1 + plane->D) * plane->negiC;
  if ((int)CONCAT71(in_register_00000011,underside) != 0) {
    dVar7 = dVar7 + -1.52587890625e-05;
  }
  uVar3 = (peVar4->XFloor).lightlist.Count;
  if (1 < (ulong)uVar3) {
    plVar5 = (peVar4->XFloor).lightlist.Array;
    lVar6 = (ulong)uVar3 - 1;
    do {
      if ((plVar5[1].plane.normal.Y * dVar2 + plVar5[1].plane.normal.X * dVar1 + plVar5[1].plane.D)
          * plVar5[1].plane.negiC <= dVar7) {
        return plVar5;
      }
      plVar5 = plVar5 + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  return (peVar4->XFloor).lightlist.Array + (uVar3 - 1);
}

Assistant:

lightlist_t * P_GetPlaneLight(sector_t * sector, secplane_t * plane, bool underside)
{
	unsigned   i;
	TArray<lightlist_t> &lightlist = sector->e->XFloor.lightlist;

	double planeheight=plane->ZatPoint(sector->centerspot);
	if(underside) planeheight-= EQUAL_EPSILON;
	
	for(i = 1; i < lightlist.Size(); i++)
		if (lightlist[i].plane.ZatPoint(sector->centerspot) <= planeheight) 
			return &lightlist[i - 1];
		
	return &lightlist[lightlist.Size() - 1];
}